

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

void Cec_AddClausesMux(Cec_ManSat_t *p,Gia_Obj_t *pNode)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  uint uVar12;
  int pLits [4];
  Gia_Obj_t *pNodeE;
  Gia_Obj_t *pNodeT;
  uint local_78;
  uint local_74;
  uint local_70;
  lit local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  Gia_Obj_t *local_58;
  uint local_4c;
  Gia_Obj_t *local_48;
  ulong local_40;
  ulong local_38;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Gia_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                  ,0x45,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
  }
  iVar8 = Gia_ObjIsMuxType(pNode);
  if (iVar8 == 0) {
    __assert_fail("Gia_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                  ,0x46,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
  }
  pGVar9 = Gia_ObjRecognizeMux(pNode,&local_48,&local_58);
  pGVar6 = local_58;
  pGVar2 = p->pAig->pObjs;
  if ((((pGVar2 <= pNode) && (pGVar1 = pGVar2 + p->pAig->nObjs, pNode < pGVar1)) &&
      (pGVar2 <= pGVar9)) && (pGVar9 < pGVar1)) {
    pGVar10 = (Gia_Obj_t *)((ulong)local_48 & 0xfffffffffffffffe);
    if ((pGVar2 <= pGVar10) && (pGVar10 < pGVar1)) {
      pGVar11 = (Gia_Obj_t *)((ulong)local_58 & 0xfffffffffffffffe);
      if ((pGVar2 <= pGVar11) && (pGVar11 < pGVar1)) {
        piVar3 = p->pSatVars;
        local_38 = (ulong)(uint)piVar3[(int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2) *
                                       -0x55555555];
        local_40 = (ulong)(uint)piVar3[(int)((ulong)((long)pGVar11 - (long)pGVar2) >> 2) *
                                       -0x55555555];
        local_5c = piVar3[(int)((ulong)((long)pGVar9 - (long)pGVar2) >> 2) * -0x55555555] * 2 + 1;
        uVar4 = piVar3[(int)((ulong)((long)pGVar9 - (long)pGVar2) >> 2) * -0x55555555] * 2;
        local_64 = ((uint)local_48 & 1) +
                   piVar3[(int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2) * -0x55555555] * 2;
        local_60 = local_64 ^ 1;
        uVar5 = piVar3[(int)((ulong)((long)pNode - (long)pGVar2) >> 2) * -0x55555555] * 2;
        local_78 = local_5c;
        local_74 = local_60;
        local_70 = uVar5;
        if (p->pPars->fPolarFlip != 0) {
          if (*(long *)pGVar9 < 0) {
            local_78 = uVar4;
          }
          if (*(long *)pGVar10 < 0) {
            local_74 = local_64;
          }
          if (*(long *)pNode < 0) {
            local_70 = uVar5 | 1;
          }
        }
        iVar8 = sat_solver_addclause(p->pSat,(lit *)&local_78,&local_6c);
        if (iVar8 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                        ,100,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
        }
        local_78 = local_5c;
        local_74 = local_64;
        local_4c = uVar5 | 1;
        local_70 = local_4c;
        if (p->pPars->fPolarFlip != 0) {
          if (*(long *)pGVar9 < 0) {
            local_78 = uVar4;
          }
          if (*(long *)((ulong)local_48 & 0xfffffffffffffffe) < 0) {
            local_74 = local_60;
          }
          if (*(long *)pNode < 0) {
            local_70 = uVar5;
          }
        }
        iVar8 = sat_solver_addclause(p->pSat,(lit *)&local_78,&local_6c);
        if (iVar8 != 0) {
          local_68 = ((uint)pGVar6 & 1) + (int)local_40 * 2;
          uVar12 = local_68 ^ 1;
          local_78 = uVar4;
          local_74 = uVar12;
          local_70 = uVar5;
          if (p->pPars->fPolarFlip != 0) {
            if (*(long *)pGVar9 < 0) {
              local_78 = local_5c;
            }
            if (*(long *)((ulong)local_58 & 0xfffffffffffffffe) < 0) {
              local_74 = local_68;
            }
            if (*(long *)pNode < 0) {
              local_70 = local_4c;
            }
          }
          iVar8 = sat_solver_addclause(p->pSat,(lit *)&local_78,&local_6c);
          uVar7 = local_4c;
          if (iVar8 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                          ,0x7a,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
          }
          local_74 = local_68;
          local_70 = local_4c;
          local_78 = uVar4;
          if (p->pPars->fPolarFlip != 0) {
            if (*(long *)pGVar9 < 0) {
              local_78 = local_5c;
            }
            if (*(long *)((ulong)local_58 & 0xfffffffffffffffe) < 0) {
              local_74 = uVar12;
            }
            if (*(long *)pNode < 0) {
              local_70 = uVar5;
            }
          }
          iVar8 = sat_solver_addclause(p->pSat,(lit *)&local_78,&local_6c);
          if (iVar8 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                          ,0x85,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
          }
          if ((int)local_38 != (int)local_40) {
            local_78 = local_64;
            local_74 = local_68;
            local_70 = uVar7;
            if (p->pPars->fPolarFlip != 0) {
              if (*(long *)((ulong)local_48 & 0xfffffffffffffffe) < 0) {
                local_78 = local_60;
              }
              if (*(long *)((ulong)local_58 & 0xfffffffffffffffe) < 0) {
                local_74 = uVar12;
              }
              if (*(long *)pNode < 0) {
                local_70 = uVar5;
              }
            }
            iVar8 = sat_solver_addclause(p->pSat,(lit *)&local_78,&local_6c);
            if (iVar8 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                            ,0x9e,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
            }
            local_78 = local_60;
            local_74 = uVar12;
            local_70 = uVar5;
            if (p->pPars->fPolarFlip != 0) {
              if (*(long *)((ulong)local_48 & 0xfffffffffffffffe) < 0) {
                local_78 = local_64;
              }
              if (*(long *)((ulong)local_58 & 0xfffffffffffffffe) < 0) {
                local_74 = local_68;
              }
              if (*(long *)pNode < 0) {
                local_70 = uVar7;
              }
            }
            iVar8 = sat_solver_addclause(p->pSat,(lit *)&local_78,&local_6c);
            if (iVar8 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                            ,0xa9,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
            }
          }
          return;
        }
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                      ,0x6f,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_AddClausesMux( Cec_ManSat_t * p, Gia_Obj_t * pNode )
{
    Gia_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Gia_IsComplement( pNode ) );
    assert( Gia_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Gia_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Cec_ObjSatNum(p,pNode);
    VarI = Cec_ObjSatNum(p,pNodeI);
    VarT = Cec_ObjSatNum(p,Gia_Regular(pNodeT));
    VarE = Cec_ObjSatNum(p,Gia_Regular(pNodeE));
    // get the complementation flags
    fCompT = Gia_IsComplement(pNodeT);
    fCompE = Gia_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}